

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O0

void Fra_ClassesLatchCorr(Fra_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pNode;
  Aig_Obj_t **ppAVar2;
  int local_1c;
  int nEntries;
  int i;
  Aig_Obj_t *pObj;
  Fra_Man_t *p_local;
  
  Vec_PtrClear(p->pCla->vClasses1);
  local_1c = Aig_ManCiNum(p->pManAig);
  iVar1 = Aig_ManRegNum(p->pManAig);
  for (local_1c = local_1c - iVar1; iVar1 = Vec_PtrSize(p->pManAig->vCis), local_1c < iVar1;
      local_1c = local_1c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vCis,local_1c);
    Vec_PtrPush(p->pCla->vClasses1,pObj_00);
    pNode = Aig_ManConst1(p->pManAig);
    Fra_ClassObjSetRepr(pObj_00,pNode);
  }
  iVar1 = Vec_PtrSize(p->pCla->vClasses1);
  ppAVar2 = (Aig_Obj_t **)malloc((long)(iVar1 * 2) << 3);
  p->pCla->pMemClasses = ppAVar2;
  p->pCla->pMemClassesFree = p->pCla->pMemClasses;
  return;
}

Assistant:

void Fra_ClassesLatchCorr( Fra_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, nEntries = 0;
    Vec_PtrClear( p->pCla->vClasses1 );
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
    {
        Vec_PtrPush( p->pCla->vClasses1, pObj );
        Fra_ClassObjSetRepr( pObj, Aig_ManConst1(p->pManAig) );
    }
    // allocate room for classes
    p->pCla->pMemClasses = ABC_ALLOC( Aig_Obj_t *, 2*(nEntries + Vec_PtrSize(p->pCla->vClasses1)) );
    p->pCla->pMemClassesFree = p->pCla->pMemClasses + 2*nEntries;
}